

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iaf_psc_alpha.cpp
# Opt level: O0

Event * __thiscall iaf_psc_alpha::update(iaf_psc_alpha *this,double n_dt)

{
  iaf_psc_alpha *in_RDI;
  double in_XMM0_Qa;
  double in_stack_ffffffffffffffc8;
  int neuronID;
  long in_stack_ffffffffffffffd8;
  Logging *in_stack_ffffffffffffffe0;
  Event *local_8;
  
  in_RDI->dt = in_XMM0_Qa;
  if ((in_RDI->shouldCalibrate & 1U) != 0) {
    calibrate(in_RDI);
    in_RDI->shouldCalibrate = false;
  }
  if (in_RDI->r_ == 0) {
    in_RDI->y3_ = in_RDI->expm1_tau_m_ * in_RDI->y3_ +
                  in_RDI->P32_in_ * in_RDI->I_in_ +
                  in_RDI->P31_in_ * in_RDI->dI_in_ +
                  in_RDI->P32_ex_ * in_RDI->I_ex_ +
                  in_RDI->P30_ * (in_RDI->y0_ + in_RDI->param->I_e_) +
                  in_RDI->P31_ex_ * in_RDI->dI_ex_ + in_RDI->y3_;
    if (in_RDI->param->LowerBound_ <= in_RDI->y3_) {
      in_stack_ffffffffffffffc8 = in_RDI->y3_;
    }
    else {
      in_stack_ffffffffffffffc8 = in_RDI->param->LowerBound_;
    }
    in_RDI->y3_ = in_stack_ffffffffffffffc8;
  }
  else {
    in_RDI->r_ = in_RDI->r_ + -1;
  }
  in_RDI->I_ex_ = in_RDI->P21_ex_ * in_RDI->dI_ex_ + in_RDI->P22_ex_ * in_RDI->I_ex_;
  in_RDI->dI_ex_ = in_RDI->P11_ex_ * in_RDI->dI_ex_;
  in_RDI->weighted_spikes_ex_ = in_RDI->ex_spikes_;
  in_RDI->dI_ex_ = in_RDI->EPSCInitialValue_ * in_RDI->weighted_spikes_ex_ + in_RDI->dI_ex_;
  in_RDI->I_in_ = in_RDI->P21_in_ * in_RDI->dI_in_ + in_RDI->P22_in_ * in_RDI->I_in_;
  in_RDI->dI_in_ = in_RDI->P11_in_ * in_RDI->dI_in_;
  in_RDI->weighted_spikes_in_ = in_RDI->in_spikes_;
  in_RDI->dI_in_ = in_RDI->IPSCInitialValue_ * in_RDI->weighted_spikes_in_ + in_RDI->dI_in_;
  neuronID = (int)((ulong)in_RDI >> 0x20);
  if (in_RDI->y3_ < in_RDI->param->Theta_) {
    Logging::logValue(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,neuronID,(int)in_RDI,
                      in_stack_ffffffffffffffc8);
    local_8 = (Event *)operator_new(0x18);
    NoEvent::NoEvent((NoEvent *)in_stack_ffffffffffffffe0);
  }
  else {
    in_RDI->r_ = in_RDI->RefractoryCounts_;
    in_RDI->y3_ = in_RDI->param->V_reset_;
    Logging::logValue(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,neuronID,(int)in_RDI,
                      in_stack_ffffffffffffffc8);
    local_8 = (Event *)operator_new(0x28);
    SpikeEvent::SpikeEvent((SpikeEvent *)in_stack_ffffffffffffffe0);
  }
  return local_8;
}

Assistant:

Event* iaf_psc_alpha::update(double n_dt) {
    dt = n_dt;
    if(shouldCalibrate) {
        calibrate();
        shouldCalibrate = false;
    }
    if ( r_ == 0 )
    {
      // neuron not refractory
      y3_ = P30_ * ( y0_ + param->I_e_ ) + P31_ex_ * dI_ex_ + P32_ex_ * I_ex_ + P31_in_ * dI_in_
        + P32_in_ * I_in_ + expm1_tau_m_ * y3_ + y3_;
    
      // lower bound of membrane potential
      y3_ = ( y3_ < param->LowerBound_ ? param->LowerBound_ : y3_ );
    }
    else
    {
      // neuron is absolute refractory
      --r_;
    }


    // alpha shape EPSCs
    I_ex_ = P21_ex_ * dI_ex_ + P22_ex_ * I_ex_;
    dI_ex_ *= P11_ex_;

    // Apply spikes delivered in this step; spikes arriving at T+1 have
    // an immediate effect on the state of the neuron
    weighted_spikes_ex_ = ex_spikes_;
    dI_ex_ += EPSCInitialValue_ * weighted_spikes_ex_;

    // alpha shape EPSCs
    I_in_ = P21_in_ * dI_in_ + P22_in_ * I_in_;
    dI_in_ *= P11_in_;

    // Apply spikes delivered in this step; spikes arriving at T+1 have
    // an immediate effect on the state of the neuron
    weighted_spikes_in_ = in_spikes_;
    dI_in_ += IPSCInitialValue_ * weighted_spikes_in_;


    
    // threshold crossing
    if ( y3_ >= param->Theta_ )
    {
      r_ = RefractoryCounts_;
      y3_ = param->V_reset_;
      // A supra-threshold membrane potential should never be observable.
      // The reset at the time of threshold crossing enables accurate
      // integration independent of the computation step size, see [2,3] for
      // details.
      logger->logValue(populationID, neuronID, ValueType::voltage, y3_ + param->E_L_);
      return new SpikeEvent();
    }
    logger->logValue(populationID, neuronID, ValueType::voltage, y3_ + param->E_L_);
    return new NoEvent();
}